

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

char * rtosc::Ports::collapsePath(char *p)

{
  bool bVar1;
  char *in_RDI;
  bool ppath;
  char *read_pos;
  char *write_pos;
  int consuming;
  char *p_end;
  char *local_28;
  char *local_20;
  int local_14;
  char *local_10;
  char *local_8;
  
  for (local_10 = in_RDI; *local_10 != '\0'; local_10 = local_10 + 1) {
  }
  local_28 = local_10 + -1;
  local_14 = 0;
  local_20 = local_28;
  local_10 = local_28;
  local_8 = in_RDI;
  while (local_8 <= local_28) {
    bVar1 = parent_path_p(local_28,local_8);
    if (bVar1) {
      read_path(&local_28,local_8);
      local_14 = local_14 + 1;
    }
    else if (local_14 == 0) {
      move_path(&local_28,&local_20,local_8);
    }
    else {
      read_path(&local_28,local_8);
      local_14 = local_14 + -1;
    }
  }
  return local_20 + 1;
}

Assistant:

char *Ports::collapsePath(char *p)
{
    //obtain the pointer to the last non-null char
    char *p_end = p;
    while(*p_end) p_end++;
    p_end--;

    //number of subpaths to consume
    int consuming = 0;

    char *write_pos = p_end;
    char *read_pos = p_end;
    while(read_pos >= p) {
        //per path chunk either
        //(1) find a parent ref and inc consuming
        //(2) find a normal ref and consume
        //(3) find a normal ref and write through
        bool ppath = parent_path_p(read_pos, p);
        if(ppath) {
            read_path(read_pos, p);
            consuming++;
        } else if(consuming) {
            read_path(read_pos, p);
            consuming--;
        } else
            move_path(read_pos, write_pos, p);
    }
    //return last written location, not next to write
    return write_pos+1;
}